

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1d144c::BuildSystemFrontendExecutionQueueDelegate::processHadError
          (BuildSystemFrontendExecutionQueueDelegate *this,ProcessContext *command,
          ProcessHandle handle,Twine *message)

{
  BuildSystem *this_00;
  BuildSystemDelegate *pBVar1;
  
  this_00 = getSystem(this);
  pBVar1 = llbuild::buildsystem::BuildSystem::getDelegate(this_00);
  (*pBVar1->_vptr_BuildSystemDelegate[0x18])
            (pBVar1,command,handle.id,message,pBVar1->_vptr_BuildSystemDelegate[0x18]);
  return;
}

Assistant:

virtual void processHadError(ProcessContext* command, ProcessHandle handle,
                               const Twine& message) override {
    static_cast<BuildSystemFrontendDelegate*>(&getSystem().getDelegate())->
      commandProcessHadError(
          reinterpret_cast<Command*>(command),
          BuildSystemFrontendDelegate::ProcessHandle { handle.id },
          message);
  }